

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

bool P_ActivateLine(line_t_conflict *line,AActor *mo,int side,int activationType,DVector3 *optpos)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  BYTE special;
  uint uVar4;
  
  bVar2 = P_TestActivateLine(line,mo,side,activationType,optpos);
  if ((bVar2) &&
     ((line->locknumber < 1 ||
      (bVar2 = P_CheckKeys(mo,line->locknumber,
                           line->special - 0xfU < 0xfffffffc && line->special - 9U < 0xfffffffe),
      bVar2)))) {
    uVar4 = line->flags;
    iVar3 = P_ExecuteSpecial(line->special,(line_t *)line,mo,side == 1,line->args[0],line->args[1],
                             line->args[2],line->args[3],line->args[4]);
    uVar1 = line->special;
    uVar4 = uVar4 & 0x200;
    special = (BYTE)uVar1;
    if ((uVar4 == 0) && (iVar3 != 0)) {
      line->special = 0;
    }
    else if (iVar3 == 0) {
      if (activationType != 8) {
        return true;
      }
      if (uVar4 != 0 || (level.flags2._2_1_ & 0x40) == 0) {
        return true;
      }
      if (special == '\0' || 0xfffffff9 < (uVar1 & 0xfe) - 0xce) {
        return true;
      }
      bVar2 = FTagManager::LineHasID(&tagManager,line,line->args[0]);
      if (!bVar2) {
        return true;
      }
      if (line->args[0] == 0) {
        return true;
      }
      iVar3 = P_FindFirstSectorFromTag(line->args[0]);
      if (iVar3 != -1) {
        return true;
      }
      P_ChangeSwitchTexture(line->sidedef[0],0,special,(bool *)0x0);
      line->special = 0;
      return true;
    }
    if (((uint)activationType < 0x11) && ((0x10104U >> (activationType & 0x1fU) & 1) != 0)) {
      P_ChangeSwitchTexture(line->sidedef[0],uVar4,special,(bool *)0x0);
    }
    bVar2 = true;
    if ((iVar3 != 0) && (3 < developer.Value)) {
      Printf("Line special %d activated on line %i\n",(ulong)(uVar1 & 0xff),
             ((long)line - (long)lines) / 0x98 & 0xffffffff);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool P_ActivateLine (line_t *line, AActor *mo, int side, int activationType, DVector3 *optpos)
{
	int lineActivation;
	INTBOOL repeat;
	INTBOOL buttonSuccess;
	BYTE special;

	if (!P_TestActivateLine (line, mo, side, activationType, optpos))
	{
		return false;
	}
	bool remote = (line->special != 7 && line->special != 8 && (line->special < 11 || line->special > 14));
	if (line->locknumber > 0 && !P_CheckKeys (mo, line->locknumber, remote)) return false;
	lineActivation = line->activation;
	repeat = line->flags & ML_REPEAT_SPECIAL;
	buttonSuccess = false;
	buttonSuccess = P_ExecuteSpecial(line->special,
					line, mo, side == 1, line->args[0],
					line->args[1], line->args[2],
					line->args[3], line->args[4]);

	special = line->special;
	if (!repeat && buttonSuccess)
	{ // clear the special on non-retriggerable lines
		line->special = 0;
	}

	if (buttonSuccess)
	{
		if (activationType == SPAC_Use || activationType == SPAC_Impact || activationType == SPAC_Push)
		{
			P_ChangeSwitchTexture (line->sidedef[0], repeat, special);
		}
	}
	// some old WADs use this method to create walls that change the texture when shot.
	else if (activationType == SPAC_Impact &&					// only for shootable triggers
		(level.flags2 & LEVEL2_DUMMYSWITCHES) &&				// this is only a compatibility setting for an old hack!
		!repeat &&												// only non-repeatable triggers
		(special<Generic_Floor || special>Generic_Crusher) &&	// not for Boom's generalized linedefs
		special &&												// not for lines without a special
		tagManager.LineHasID(line, line->args[0]) &&							// Safety check: exclude edited UDMF linedefs or ones that don't map the tag to args[0]
		line->args[0] &&										// only if there's a tag (which is stored in the first arg)
		P_FindFirstSectorFromTag (line->args[0]) == -1)			// only if no sector is tagged to this linedef
	{
		P_ChangeSwitchTexture (line->sidedef[0], repeat, special);
		line->special = 0;
	}
// end of changed code
	if (developer >= DMSG_SPAMMY && buttonSuccess)
	{
		Printf ("Line special %d activated on line %i\n", special, int(line - lines));
	}
	return true;
}